

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

uint deflate(uchar **out,size_t *outsize,uchar *in,size_t insize,LodePNGCompressSettings *settings)

{
  int iVar1;
  uint uVar2;
  undefined8 in_RCX;
  LodePNGCompressSettings *in_RDX;
  size_t in_RSI;
  uchar *in_RDI;
  long in_R8;
  uint error;
  uchar **unaff_retaddr;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  if (*(long *)(in_R8 + 0x20) == 0) {
    uVar2 = lodepng_deflate(unaff_retaddr,
                            (size_t *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                            in_RDI,in_RSI,in_RDX);
  }
  else {
    iVar1 = (**(code **)(in_R8 + 0x20))(in_RDI,in_RSI,in_RDX,in_RCX,in_R8);
    uVar2 = 0;
    if (iVar1 != 0) {
      uVar2 = 0x6f;
    }
  }
  return uVar2;
}

Assistant:

static unsigned deflate(unsigned char** out, size_t* outsize,
                        const unsigned char* in, size_t insize,
                        const LodePNGCompressSettings* settings) {
  if(settings->custom_deflate) {
    unsigned error = settings->custom_deflate(out, outsize, in, insize, settings);
    /*the custom deflate is allowed to have its own error codes, however, we translate it to code 111*/
    return error ? 111 : 0;
  } else {
    return lodepng_deflate(out, outsize, in, insize, settings);
  }
}